

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O3

void __thiscall
glcts::FormatInfo::FormatInfo(FormatInfo *this,GLenum internalFormat,GLuint offsetAlignment)

{
  this->m_aligned_size = 0;
  this->m_not_aligned_size = 0;
  this->m_ssbo_value_size = 0;
  this->m_internal_format = internalFormat;
  this->m_offset_alignment = offsetAlignment;
  this->m_n_components = 0;
  this->m_input_type = 0;
  *(undefined8 *)((long)&this->m_input_type + 1) = 0;
  (this->m_image_format_name)._M_dataplus._M_p = (pointer)&(this->m_image_format_name).field_2;
  (this->m_image_format_name)._M_string_length = 0;
  (this->m_image_format_name).field_2._M_local_buf[0] = '\0';
  (this->m_image_type_name)._M_dataplus._M_p = (pointer)&(this->m_image_type_name).field_2;
  (this->m_image_type_name)._M_string_length = 0;
  (this->m_image_type_name).field_2._M_local_buf[0] = '\0';
  (this->m_sampler_type_name)._M_dataplus._M_p = (pointer)&(this->m_sampler_type_name).field_2;
  (this->m_sampler_type_name)._M_string_length = 0;
  (this->m_sampler_type_name).field_2._M_local_buf[0] = '\0';
  (this->m_output_type_name)._M_dataplus._M_p = (pointer)&(this->m_output_type_name).field_2;
  (this->m_output_type_name)._M_string_length = 0;
  (this->m_output_type_name).field_2._M_local_buf[0] = '\0';
  (this->m_value_selector)._M_dataplus._M_p = (pointer)&(this->m_value_selector).field_2;
  (this->m_value_selector)._M_string_length = 0;
  (this->m_value_selector).field_2._M_local_buf[0] = '\0';
  configure(this);
  return;
}

Assistant:

FormatInfo::FormatInfo(glw::GLenum internalFormat, glw::GLuint offsetAlignment)
	: m_aligned_size(0)
	, m_not_aligned_size(0)
	, m_ssbo_value_size(0)
	, m_internal_format(internalFormat)
	, m_offset_alignment(offsetAlignment)
	, m_n_components(0)
	, m_input_type(GL_NONE)
	, m_output_type(GL_NONE)
	, m_is_image_supported(false)
{
	configure();
}